

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

void poll_cb(uv_fs_t *req)

{
  int iVar1;
  uv_timer_cb cb;
  ulong uVar2;
  uint64_t uVar3;
  long in_RDI;
  uint64_t interval;
  poll_ctx *ctx;
  uv_stat_t *statbuf;
  uv_close_cb in_stack_ffffffffffffffd8;
  uv_handle_t *in_stack_ffffffffffffffe0;
  uv_stat_t *in_stack_fffffffffffffff0;
  
  cb = (uv_timer_cb)(in_RDI + -0xa8);
  if (*(long *)cb == 0) {
    uv_close(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    uv_fs_req_cleanup((uv_fs_t *)0x108503);
  }
  else {
    if (*(long *)(in_RDI + 0x38) == 0) {
      in_stack_fffffffffffffff0 = (uv_stat_t *)(in_RDI + 0x50);
      if ((*(int *)(in_RDI + -0xa0) != 0) &&
         ((*(int *)(in_RDI + -0xa0) < 0 ||
          (iVar1 = statbuf_eq((uv_stat_t *)(in_RDI + 0x160),in_stack_fffffffffffffff0), iVar1 == 0))
         )) {
        (**(code **)(cb + 0x20))(*(long *)cb,0,cb + 0x208,in_stack_fffffffffffffff0);
      }
      memcpy(cb + 0x208,in_stack_fffffffffffffff0,0xa0);
      *(undefined4 *)(cb + 8) = 1;
    }
    else if ((long)*(int *)(in_RDI + -0xa0) != *(long *)(in_RDI + 0x38)) {
      (**(code **)(in_RDI + -0x88))
                (*(long *)cb,*(ulong *)(in_RDI + 0x38) & 0xffffffff,in_RDI + 0x160,&zero_statbuf);
      *(int *)(cb + 8) = (int)*(undefined8 *)(in_RDI + 0x38);
    }
    uv_fs_req_cleanup((uv_fs_t *)0x108609);
    if (*(long *)cb == 0) {
      uv_close(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    else {
      uVar2 = (ulong)*(uint *)(cb + 0xc);
      uVar3 = uv_now(*(uv_loop_t **)(cb + 0x18));
      iVar1 = uv_timer_start((uv_timer_t *)in_stack_fffffffffffffff0,cb,
                             uVar2 - (uVar3 - *(long *)(cb + 0x10)) % uVar2,
                             (uint64_t)in_stack_ffffffffffffffd8);
      if (iVar1 != 0) {
        abort();
      }
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_t* req) {
  uv_stat_t* statbuf;
  struct poll_ctx* ctx;
  uint64_t interval;

  ctx = container_of(req, struct poll_ctx, fs_req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped or closed */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    uv_fs_req_cleanup(req);
    return;
  }

  if (req->result != 0) {
    if (ctx->busy_polling != req->result) {
      ctx->poll_cb(ctx->parent_handle,
                   req->result,
                   &ctx->statbuf,
                   &zero_statbuf);
      ctx->busy_polling = req->result;
    }
    goto out;
  }

  statbuf = &req->statbuf;

  if (ctx->busy_polling != 0)
    if (ctx->busy_polling < 0 || !statbuf_eq(&ctx->statbuf, statbuf))
      ctx->poll_cb(ctx->parent_handle, 0, &ctx->statbuf, statbuf);

  ctx->statbuf = *statbuf;
  ctx->busy_polling = 1;

out:
  uv_fs_req_cleanup(req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped by callback */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    return;
  }

  /* Reschedule timer, subtract the delay from doing the stat(). */
  interval = ctx->interval;
  interval -= (uv_now(ctx->loop) - ctx->start_time) % interval;

  if (uv_timer_start(&ctx->timer_handle, timer_cb, interval, 0))
    abort();
}